

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O0

void __thiscall
glcts::TessellationShaderInvarianceRule1Test::getIterationProperties
          (TessellationShaderInvarianceRule1Test *this,uint n_iteration,float *out_inner_tess_levels
          ,float *out_outer_tess_levels,bool *out_point_mode,
          _tessellation_primitive_mode *out_primitive_mode,
          _tessellation_shader_vertex_ordering *out_vertex_ordering,uint *out_result_buffer_size)

{
  uint uVar1;
  int iVar2;
  TestError *this_00;
  _tessellation_primitive_mode *out_primitive_mode_local;
  bool *out_point_mode_local;
  float *out_outer_tess_levels_local;
  float *out_inner_tess_levels_local;
  uint n_iteration_local;
  TessellationShaderInvarianceRule1Test *this_local;
  
  *out_vertex_ordering = TESSELLATION_SHADER_VERTEX_ORDERING_CCW;
  if (n_iteration == 0) {
LAB_015de457:
    *out_inner_tess_levels = 1.0;
    *out_outer_tess_levels = 1.0;
    out_outer_tess_levels[1] = 1.0;
    out_outer_tess_levels[2] = 1.0;
    *out_point_mode = true;
    *out_primitive_mode = TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES;
    goto LAB_015de59c;
  }
  if (n_iteration == 1) {
LAB_015de4af:
    *out_outer_tess_levels = 1.0;
    out_outer_tess_levels[1] = 1.0;
    *out_point_mode = false;
    *out_primitive_mode = TESSELLATION_SHADER_PRIMITIVE_MODE_FIRST;
  }
  else {
    if (n_iteration != 2) {
      if (n_iteration == 3) goto LAB_015de4af;
      if (n_iteration != 4) {
        if (n_iteration != 5) {
          this_00 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (this_00,"Unrecognzied iteration index",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderInvariance.cpp"
                     ,0x332);
          __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
        }
        goto LAB_015de457;
      }
    }
    *out_inner_tess_levels = 1.0;
    *out_outer_tess_levels = 1.0;
    out_outer_tess_levels[1] = 1.0;
    out_outer_tess_levels[2] = 1.0;
    *out_point_mode = false;
    *out_primitive_mode = TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES;
  }
LAB_015de59c:
  uVar1 = TessellationShaderUtils::getAmountOfVerticesGeneratedByTessellator
                    ((this->super_TessellationShaderInvarianceBaseTest).m_utils_ptr,
                     *out_primitive_mode,out_inner_tess_levels,out_outer_tess_levels,
                     TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,(bool)(*out_point_mode & 1));
  *out_result_buffer_size = uVar1;
  uVar1 = *out_result_buffer_size;
  iVar2 = (*(this->super_TessellationShaderInvarianceBaseTest).super_TestCaseBase.super_TestCase.
            super_TestNode._vptr_TestNode[7])();
  *out_result_buffer_size = uVar1 * iVar2 * 0xc;
  return;
}

Assistant:

void TessellationShaderInvarianceRule1Test::getIterationProperties(
	unsigned int n_iteration, float* out_inner_tess_levels, float* out_outer_tess_levels, bool* out_point_mode,
	_tessellation_primitive_mode* out_primitive_mode, _tessellation_shader_vertex_ordering* out_vertex_ordering,
	unsigned int* out_result_buffer_size)
{
	*out_vertex_ordering = TESSELLATION_SHADER_VERTEX_ORDERING_CCW;

	switch (n_iteration)
	{
	case 0:
	case 5:
	{
		/* Triangles (point mode) */
		out_inner_tess_levels[0] = 1.0f;
		out_outer_tess_levels[0] = 1.0f;
		out_outer_tess_levels[1] = 1.0f;
		out_outer_tess_levels[2] = 1.0f;

		*out_point_mode		= true;
		*out_primitive_mode = TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES;

		break;
	}

	case 1:
	case 3:
	{
		/* Lines */
		out_outer_tess_levels[0] = 1.0f;
		out_outer_tess_levels[1] = 1.0f;

		*out_point_mode		= false;
		*out_primitive_mode = TESSELLATION_SHADER_PRIMITIVE_MODE_ISOLINES;

		break;
	}

	case 2:
	case 4:
	{
		/* Triangles */
		out_inner_tess_levels[0] = 1.0f;
		out_outer_tess_levels[0] = 1.0f;
		out_outer_tess_levels[1] = 1.0f;
		out_outer_tess_levels[2] = 1.0f;

		*out_point_mode		= false;
		*out_primitive_mode = TESSELLATION_SHADER_PRIMITIVE_MODE_TRIANGLES;

		break;
	}

	default:
	{
		TCU_FAIL("Unrecognzied iteration index");
	}
	}

	*out_result_buffer_size = m_utils_ptr->getAmountOfVerticesGeneratedByTessellator(
		*out_primitive_mode, out_inner_tess_levels, out_outer_tess_levels, TESSELLATION_SHADER_VERTEX_SPACING_EQUAL,
		*out_point_mode);

	*out_result_buffer_size = static_cast<unsigned int>(*out_result_buffer_size * getDrawCallCountArgument() *
														3 /* components */ * sizeof(float));

	DE_ASSERT(*out_result_buffer_size != 0);
}